

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

void cuddLocalCacheQuit(DdLocalCache *cache)

{
  DdManager *pDVar1;
  DdLocalCache *pDVar2;
  DdLocalCache *pDVar3;
  DdLocalCache **ppDVar4;
  
  pDVar1 = cache->manager;
  pDVar3 = pDVar1->localCaches;
  pDVar1->memused = (pDVar1->memused - (ulong)(cache->itemsize * cache->slots)) - 0x48;
  if (pDVar3 != (DdLocalCache *)0x0) {
    if (pDVar3 == cache) {
      ppDVar4 = &pDVar1->localCaches;
    }
    else {
      do {
        pDVar2 = pDVar3;
        pDVar3 = pDVar2->next;
        if (pDVar3 == (DdLocalCache *)0x0) goto LAB_00784717;
      } while (pDVar3 != cache);
      ppDVar4 = &pDVar2->next;
    }
    *ppDVar4 = pDVar3->next;
  }
LAB_00784717:
  if (cache->item != (DdLocalCacheItem *)0x0) {
    free(cache->item);
    cache->item = (DdLocalCacheItem *)0x0;
  }
  free(cache);
  return;
}

Assistant:

void
cuddLocalCacheQuit(
  DdLocalCache * cache /* cache to be shut down */)
{
    cache->manager->memused -=
        cache->slots * cache->itemsize + sizeof(DdLocalCache);
    cuddLocalCacheRemoveFromList(cache);
    ABC_FREE(cache->item);
    ABC_FREE(cache);

    return;

}